

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaThread.cpp
# Opt level: O0

Value __thiscall xmrig::CudaThread::toJSON(CudaThread *this,Document *doc)

{
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *in_RDX;
  undefined8 extraout_RDX;
  CudaThread *in_RSI;
  char *__s;
  undefined8 in_RDI;
  GenericStringRef<char> GVar1;
  Value VVar2;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Value *out;
  undefined4 in_stack_ffffffffffffff28;
  Type in_stack_ffffffffffffff2c;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffff30;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff84;
  StringRefType *in_stack_ffffffffffffff88;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_ffffffffffffff90;
  
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GetAllocator(in_RDX);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  __s = kIndex;
  GVar1 = rapidjson::StringRef<char>
                    ((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  index(in_RSI,__s,GVar1.length);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
             in_stack_ffffffffffffff78);
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  threads(in_RSI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                 in_stack_ffffffffffffff78);
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  blocks(in_RSI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                 in_stack_ffffffffffffff78);
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  bfactor(in_RSI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                 in_stack_ffffffffffffff78);
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  bsleep(in_RSI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                 in_stack_ffffffffffffff78);
  rapidjson::StringRef<char>((char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  affinity(in_RSI);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<long>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                  CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                  in_stack_ffffffffffffff78);
  VVar2.data_.s.str = (Ch *)extraout_RDX;
  VVar2.data_.n = (Number)in_RDI;
  return (Value)VVar2.data_;
}

Assistant:

rapidjson::Value xmrig::CudaThread::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value out(kObjectType);

    out.AddMember(StringRef(kIndex),        index(), allocator);
    out.AddMember(StringRef(kThreads),      threads(), allocator);
    out.AddMember(StringRef(kBlocks),       blocks(), allocator);
    out.AddMember(StringRef(kBFactor),      bfactor(), allocator);
    out.AddMember(StringRef(kBSleep),       bsleep(), allocator);
    out.AddMember(StringRef(kAffinity),     affinity(), allocator);

    return out;
}